

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.h
# Opt level: O1

void __thiscall basist::basisu_transcoder_state::clear(basisu_transcoder_state *this)

{
  undefined8 *puVar1;
  block_preds *__ptr;
  void *__ptr_00;
  vector<basist::basisu_transcoder_state::block_preds> *pvVar2;
  long lVar3;
  vector<unsigned_int> (*pavVar4) [16];
  long lVar5;
  bool bVar6;
  
  pavVar4 = this->m_prev_frame_indices;
  lVar5 = 0;
  do {
    __ptr = this->m_block_endpoint_preds[lVar5].m_p;
    if (__ptr != (block_preds *)0x0) {
      pvVar2 = this->m_block_endpoint_preds + lVar5;
      free(__ptr);
      pvVar2->m_p = (block_preds *)0x0;
      pvVar2->m_size = 0;
      pvVar2->m_capacity = 0;
    }
    lVar3 = 0;
    do {
      __ptr_00 = *(void **)((long)&(*pavVar4)[0].m_p + lVar3);
      if (__ptr_00 != (void *)0x0) {
        puVar1 = (undefined8 *)((long)&(*pavVar4)[0].m_p + lVar3);
        free(__ptr_00);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x100);
    pavVar4 = pavVar4 + 1;
    bVar6 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar6);
  return;
}

Assistant:

void clear()
		{
			for (uint32_t i = 0; i < 2; i++)
			{
				m_block_endpoint_preds[i].clear();

				for (uint32_t j = 0; j < cMaxPrevFrameLevels; j++)
					m_prev_frame_indices[i][j].clear();
			}
		}